

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_stream.cpp
# Opt level: O2

MemoryStream * __thiscall duckdb::MemoryStream::operator=(MemoryStream *this,MemoryStream *other)

{
  idx_t iVar1;
  Allocator *this_00;
  
  if (this != other) {
    if ((this->allocator).ptr != (Allocator *)0x0) {
      this_00 = optional_ptr<duckdb::Allocator,_true>::operator->(&this->allocator);
      Allocator::FreeData(this_00,this->data,this->capacity);
    }
    this->data = other->data;
    this->capacity = other->capacity;
    iVar1 = other->position;
    (this->allocator).ptr = (other->allocator).ptr;
    this->position = iVar1;
    other->capacity = 0;
    other->data = (data_ptr_t)0x0;
    (other->allocator).ptr = (Allocator *)0x0;
    other->position = 0;
  }
  return this;
}

Assistant:

MemoryStream &MemoryStream::operator=(MemoryStream &&other) noexcept {
	if (this != &other) {
		// Free the current data
		if (allocator) {
			allocator->FreeData(data, capacity);
		}

		// Move the data from the other stream into this stream
		data = other.data;
		position = other.position;
		capacity = other.capacity;
		allocator = other.allocator;

		// Reset the other stream
		other.data = nullptr;
		other.position = 0;
		other.capacity = 0;
		other.allocator = nullptr;
	}
	return *this;
}